

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidobjs.c
# Opt level: O3

FT_Error cid_size_request(FT_Size size,FT_Size_Request req)

{
  undefined8 *puVar1;
  code *pcVar2;
  FT_Module pFVar3;
  long lVar4;
  PSHinter_Service pshinter;
  
  FT_Request_Metrics(size->face,req);
  puVar1 = (undefined8 *)size->face[2].bbox.yMin;
  pFVar3 = FT_Get_Module((size->face->driver->root).library,"pshinter");
  if ((puVar1 != (undefined8 *)0x0 && pFVar3 != (FT_Module)0x0) &&
     (pcVar2 = (code *)*puVar1, pcVar2 != (code *)0x0)) {
    lVar4 = (*pcVar2)(pFVar3);
    if (lVar4 != 0) {
      (**(code **)(lVar4 + 8))
                (size->internal->module_data,(size->metrics).x_scale,(size->metrics).y_scale,0,0);
    }
  }
  return 0;
}

Assistant:

FT_LOCAL( FT_Error )
  cid_size_request( FT_Size          size,
                    FT_Size_Request  req )
  {
    PSH_Globals_Funcs  funcs;


    FT_Request_Metrics( size->face, req );

    funcs = cid_size_get_globals_funcs( (CID_Size)size );

    if ( funcs )
      funcs->set_scale( (PSH_Globals)size->internal->module_data,
                        size->metrics.x_scale,
                        size->metrics.y_scale,
                        0, 0 );

    return FT_Err_Ok;
  }